

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_pcall(lua_State *L,int nargs,int nresults,int errfunc)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  TValue *pTVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  lua_State *in_RDI;
  cTValue *o;
  int status;
  ptrdiff_t ef;
  uint8_t oldh;
  global_State *g;
  long local_30;
  
  uVar3 = (ulong)(in_RDI->glref).ptr32;
  bVar1 = *(byte *)(uVar3 + 0x91);
  if (in_ECX == 0) {
    local_30 = 0;
  }
  else {
    pTVar4 = stkindex2adr(in_RDI,in_ECX);
    local_30 = (long)pTVar4 - (ulong)(in_RDI->stack).ptr32;
  }
  iVar2 = lj_vm_pcall(in_RDI,in_RDI->top + -(long)in_ESI,in_EDX + 1,local_30);
  if (iVar2 != 0) {
    *(byte *)(uVar3 + 0x91) = *(byte *)(uVar3 + 0x91) & 0xf | bVar1 & 0xf0;
  }
  return iVar2;
}

Assistant:

LUA_API int lua_pcall(lua_State *L, int nargs, int nresults, int errfunc)
{
  global_State *g = G(L);
  uint8_t oldh = hook_save(g);
  ptrdiff_t ef;
  int status;
  api_check(L, L->status == 0 || L->status == LUA_ERRERR);
  api_checknelems(L, nargs+1);
  if (errfunc == 0) {
    ef = 0;
  } else {
    cTValue *o = stkindex2adr(L, errfunc);
    api_checkvalidindex(L, o);
    ef = savestack(L, o);
  }
  status = lj_vm_pcall(L, L->top - nargs, nresults+1, ef);
  if (status) hook_restore(g, oldh);
  return status;
}